

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.hpp
# Opt level: O0

void __thiscall OpenMD::Bend::Bend(Bend *this,Atom *atom1,Atom *atom2,Atom *atom3,BendType *bt)

{
  reference ppAVar1;
  value_type in_RCX;
  value_type in_RDX;
  value_type in_RSI;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_RDI;
  pointer in_R8;
  ShortRangeInteraction *in_stack_ffffffffffffffb0;
  string *this_00;
  
  ShortRangeInteraction::ShortRangeInteraction(in_stack_ffffffffffffffb0);
  (in_RDI->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__Bend_00510750;
  in_RDI[4].super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[4].super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_R8;
  this_00 = (string *)(in_RDI + 5);
  std::__cxx11::string::string(this_00);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::resize(in_RDI,(size_type)this_00);
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                       &(in_RDI->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  *ppAVar1 = in_RSI;
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                       &(in_RDI->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  *ppAVar1 = in_RDX;
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                       &(in_RDI->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage,2);
  *ppAVar1 = in_RCX;
  return;
}

Assistant:

Bend(Atom* atom1, Atom* atom2, Atom* atom3, BendType* bt) :
        ShortRangeInteraction(), bendType_(bt) {
      atoms_.resize(3);
      atoms_[0] = atom1;
      atoms_[1] = atom2;
      atoms_[2] = atom3;
    }